

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Term> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Term>(RecursiveDescentParser *this)

{
  istream *piVar1;
  bool bVar2;
  SyntaxError *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  long lVar5;
  char *pcVar6;
  Number *this_00;
  shared_ptr<MyCompiler::Term> sVar7;
  allocator local_71;
  shared_ptr<MyCompiler::Factor> p2;
  shared_ptr<MyCompiler::MulDivOp> p1;
  string local_50;
  
  std::make_shared<MyCompiler::Term>();
  parse<MyCompiler::Factor>((RecursiveDescentParser *)&local_50);
  std::__shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x48),
             (__shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  _Var4._M_pi = extraout_RDX;
  do {
    if (1 < *(int *)(in_RSI + 0x30) - 5U) {
      sVar7.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      sVar7.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<MyCompiler::Term>)
             sVar7.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>;
    }
    parse<MyCompiler::MulDivOp>((RecursiveDescentParser *)&p1);
    parse<MyCompiler::Factor>((RecursiveDescentParser *)&p2);
    piVar1 = this->stream;
    if (((*(int *)(*(long *)(piVar1 + 0x48) + 4) == 1) &&
        (((p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_AbstractAstNode).caseNum == 1)) &&
       (*(long *)(piVar1 + 0x58) == *(long *)(piVar1 + 0x60))) {
      bVar2 = std::operator==(&((p1.
                                 super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_AbstractAstNode).value,"*");
      if (bVar2) {
        this_00 = *(Number **)(*(long *)(this->stream + 0x48) + 0x58);
        lVar5 = (((p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 pNumber).super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->num * this_00->num;
      }
      else {
        lVar5 = (((p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 pNumber).super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->num;
        if (lVar5 == 0) {
          pSVar3 = (SyntaxError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_50,"attempt to division by zero",&local_71);
          SyntaxError::SyntaxError(pSVar3,&local_50);
          __cxa_throw(pSVar3,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = *(Number **)(*(long *)(this->stream + 0x48) + 0x58);
        lVar5 = this_00->num / lVar5;
      }
      Number::setNum(this_00,lVar5);
      lVar5 = *(long *)(*(long *)(*(long *)(this->stream + 0x48) + 0x58) + 0x48);
      if ((int)lVar5 != lVar5) {
        pSVar3 = (SyntaxError *)__cxa_allocate_exception(0x10);
        bVar2 = std::operator==(&((p1.
                                   super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_AbstractAstNode).value,"*");
        pcVar6 = "attempt to divide with overflow";
        if (bVar2) {
          pcVar6 = "attempt to multiply with overflow";
        }
        std::__cxx11::string::string((string *)&local_50,pcVar6,&local_71);
        SyntaxError::SyntaxError(pSVar3,&local_50);
        __cxa_throw(pSVar3,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::
      vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
      ::emplace_back<MyCompiler::MulDivOp&,MyCompiler::Factor&>
                ((vector<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>,std::allocator<std::pair<MyCompiler::MulDivOp,MyCompiler::Factor>>>
                  *)(piVar1 + 0x58),
                 p1.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p2.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p1.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    _Var4._M_pi = extraout_RDX_00;
  } while( true );
}

Assistant:

std::shared_ptr<MyCompiler::Term> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Term>();

    pResult->pFactor = parse<Factor>();
    while (sym == SymbolType::TIMES || sym == SymbolType::SLASH)
    {
        auto p1 = parse<MulDivOp>();
        auto p2 = parse<Factor>();
        if (pResult->pFactor->caseNum == 1 && p2->caseNum == 1 && pResult->vMulDivOpFactor.empty())
        {
            if (p1->value == "*")
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num * p2->pNumber->num);
            else if (p2->pNumber->num != 0)
                pResult->pFactor->pNumber->setNum(pResult->pFactor->pNumber->num / p2->pNumber->num);
            else
                throw SyntaxError("attempt to division by zero");
            if (pResult->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "*" ? "attempt to multiply with overflow" : "attempt to divide with overflow");
        }
        else
            pResult->vMulDivOpFactor.emplace_back(*p1, *p2);
    }

    return pResult;
}